

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateGeneralTests.cpp
# Opt level: O0

void __thiscall
vkt::DynamicState::anon_unknown_4::StatePersistenceTestInstance::StatePersistenceTestInstance
          (StatePersistenceTestInstance *this,Context *context,ShaderMap *shaders)

{
  char *vertexShaderName;
  mapped_type *ppcVar1;
  Vec4 local_2d8;
  Vector<float,_4> local_2c8;
  PositionColorVertex local_2b8;
  deUint32 local_298;
  Vec4 local_294;
  Vector<float,_4> local_284;
  PositionColorVertex local_274;
  deUint32 local_254;
  Vec4 local_250;
  Vector<float,_4> local_240;
  PositionColorVertex local_230;
  deUint32 local_210;
  Vec4 local_20c;
  Vector<float,_4> local_1fc;
  PositionColorVertex local_1ec;
  deUint32 local_1cc;
  Vec4 local_1c8;
  Vector<float,_4> local_1b8;
  PositionColorVertex local_1a8;
  deUint32 local_188;
  Vec4 local_184;
  Vector<float,_4> local_174;
  PositionColorVertex local_164;
  deUint32 local_144;
  Vec4 local_140;
  Vector<float,_4> local_130;
  PositionColorVertex local_120;
  deUint32 local_100;
  Vec4 local_fc;
  Vector<float,_4> local_ec;
  PositionColorVertex local_dc;
  deUint32 local_bc;
  Vec4 local_b8;
  Vector<float,_4> local_a8;
  PositionColorVertex local_98;
  deUint32 local_78;
  Vec4 local_74;
  Vector<float,_4> local_64;
  PositionColorVertex local_54;
  key_type local_28 [2];
  ShaderMap *local_20;
  ShaderMap *shaders_local;
  Context *context_local;
  StatePersistenceTestInstance *this_local;
  
  local_28[1] = 0;
  local_20 = shaders;
  shaders_local = (ShaderMap *)context;
  context_local = (Context *)this;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[](shaders,local_28 + 1);
  vertexShaderName = *ppcVar1;
  local_28[0] = SHADERTYPE_FRAGMENT;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[](shaders,local_28);
  DynamicStateBaseClass::DynamicStateBaseClass
            (&this->super_DynamicStateBaseClass,context,vertexShaderName,*ppcVar1);
  (this->super_DynamicStateBaseClass).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__StatePersistenceTestInstance_016ac370;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::Move(&this->m_pipelineAdditional);
  tcu::Vector<float,_4>::Vector(&local_64,-1.0,1.0,1.0,1.0);
  local_78 = (deUint32)tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&local_74);
  PositionColorVertex::PositionColorVertex(&local_54,&local_64,&local_74);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DynamicStateBaseClass).m_data,&local_54);
  tcu::Vector<float,_4>::Vector(&local_a8,1.0,1.0,1.0,1.0);
  local_bc = (deUint32)tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&local_b8);
  PositionColorVertex::PositionColorVertex(&local_98,&local_a8,&local_b8);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DynamicStateBaseClass).m_data,&local_98);
  tcu::Vector<float,_4>::Vector(&local_ec,-1.0,-1.0,1.0,1.0);
  local_100 = (deUint32)tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&local_fc);
  PositionColorVertex::PositionColorVertex(&local_dc,&local_ec,&local_fc);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DynamicStateBaseClass).m_data,&local_dc);
  tcu::Vector<float,_4>::Vector(&local_130,1.0,-1.0,1.0,1.0);
  local_144 = (deUint32)tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&local_140);
  PositionColorVertex::PositionColorVertex(&local_120,&local_130,&local_140);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DynamicStateBaseClass).m_data,&local_120);
  tcu::Vector<float,_4>::Vector(&local_174,-1.0,1.0,1.0,1.0);
  local_188 = (deUint32)tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_184);
  PositionColorVertex::PositionColorVertex(&local_164,&local_174,&local_184);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DynamicStateBaseClass).m_data,&local_164);
  tcu::Vector<float,_4>::Vector(&local_1b8,1.0,1.0,1.0,1.0);
  local_1cc = (deUint32)tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_1c8);
  PositionColorVertex::PositionColorVertex(&local_1a8,&local_1b8,&local_1c8);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DynamicStateBaseClass).m_data,&local_1a8);
  tcu::Vector<float,_4>::Vector(&local_1fc,-1.0,-1.0,1.0,1.0);
  local_210 = (deUint32)tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_20c);
  PositionColorVertex::PositionColorVertex(&local_1ec,&local_1fc,&local_20c);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DynamicStateBaseClass).m_data,&local_1ec);
  tcu::Vector<float,_4>::Vector(&local_240,-1.0,-1.0,1.0,1.0);
  local_254 = (deUint32)tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_250);
  PositionColorVertex::PositionColorVertex(&local_230,&local_240,&local_250);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DynamicStateBaseClass).m_data,&local_230);
  tcu::Vector<float,_4>::Vector(&local_284,1.0,1.0,1.0,1.0);
  local_298 = (deUint32)tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_294);
  PositionColorVertex::PositionColorVertex(&local_274,&local_284,&local_294);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DynamicStateBaseClass).m_data,&local_274);
  tcu::Vector<float,_4>::Vector(&local_2c8,1.0,-1.0,1.0,1.0);
  tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_2d8);
  PositionColorVertex::PositionColorVertex(&local_2b8,&local_2c8,&local_2d8);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DynamicStateBaseClass).m_data,&local_2b8);
  DynamicStateBaseClass::initialize(&this->super_DynamicStateBaseClass);
  return;
}

Assistant:

StatePersistenceTestInstance (Context& context, ShaderMap shaders)
		: DynamicStateBaseClass (context, shaders[glu::SHADERTYPE_VERTEX], shaders[glu::SHADERTYPE_FRAGMENT])
	{
		m_data.push_back(PositionColorVertex(tcu::Vec4(-1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(-1.0f, -1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(1.0f, -1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));

		m_data.push_back(PositionColorVertex(tcu::Vec4(-1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(-1.0f, -1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(-1.0f, -1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(1.0f, -1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));

		DynamicStateBaseClass::initialize();
	}